

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_test.c
# Opt level: O1

void test_ws_recv_max(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  char *pcVar4;
  undefined1 local_348 [8];
  char buf [256];
  char msg [256];
  char url [256];
  int port;
  nng_dialer d;
  size_t sz;
  nng_socket local_30;
  nng_listener l;
  nng_socket s1;
  nng_socket s0;
  
  memset(buf + 0xf8,0,0x100);
  snprintf(msg + 0xf8,0x100,"ws://127.0.0.1:%d/ws_recv_max",0);
  nVar1 = nng_pair1_open((nng_socket *)&l);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                         ,0x9f,"%s: expected success, got %s (%d)","nng_pair1_open(&(s0))",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_socket_set_ms((nng_socket)l.id,"recv-timeout",100);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                           ,0xa0,"%s: expected success, got %s (%d)",
                           "nng_socket_set_ms(s0, NNG_OPT_RECVTIMEO, 100)",pcVar3,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_socket_set_size((nng_socket)l.id,"recv-size-max",200);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                             ,0xa1,"%s: expected success, got %s (%d)",
                             "nng_socket_set_size(s0, NNG_OPT_RECVMAXSZ, 200)",pcVar3,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_listener_create((nng_listener *)((long)&sz + 4),(nng_socket)l.id,msg + 0xf8);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                               ,0xa2,"%s: expected success, got %s (%d)",
                               "nng_listener_create(&l, s0, url)",pcVar3,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_socket_get_size((nng_socket)l.id,"recv-size-max",(size_t *)&port);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                 ,0xa3,"%s: expected success, got %s (%d)",
                                 "nng_socket_get_size(s0, NNG_OPT_RECVMAXSZ, &sz)",pcVar3,nVar1);
          if (iVar2 != 0) {
            acutest_check_((uint)(_port == 200),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                           ,0xa4,"%s","sz == 200");
            nVar1 = nng_listener_set_size(sz._4_4_,"recv-size-max",100);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                   ,0xa5,"%s: expected success, got %s (%d)",
                                   "nng_listener_set_size(l, NNG_OPT_RECVMAXSZ, 100)",pcVar3,nVar1);
            if (iVar2 != 0) {
              nVar1 = nng_listener_get_size(sz._4_4_,"recv-size-max",(size_t *)&port);
              pcVar3 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                     ,0xa6,"%s: expected success, got %s (%d)",
                                     "nng_listener_get_size(l, NNG_OPT_RECVMAXSZ, &sz)",pcVar3,nVar1
                                    );
              if (iVar2 != 0) {
                acutest_check_((uint)(_port == 100),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                               ,0xa7,"%s","sz == 100");
                nVar1 = nng_listener_start(sz._4_4_,0);
                pcVar3 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                       ,0xa8,"%s: expected success, got %s (%d)",
                                       "nng_listener_start(l, 0)",pcVar3,nVar1);
                if (iVar2 != 0) {
                  nVar1 = nng_listener_get_int(sz._4_4_,"tcp-bound-port",(int *)(url + 0xf8));
                  pcVar3 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                         ,0xa9,"%s: expected success, got %s (%d)",
                                         "nng_listener_get_int(l, NNG_OPT_TCP_BOUND_PORT, &port)",
                                         pcVar3,nVar1);
                  if (iVar2 != 0) {
                    nVar1 = nng_pair1_open(&local_30);
                    pcVar3 = nng_strerror(nVar1);
                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                           ,0xab,"%s: expected success, got %s (%d)",
                                           "nng_pair1_open(&(s1))",pcVar3,nVar1);
                    if (iVar2 != 0) {
                      snprintf(msg + 0xf8,0x100,"ws://127.0.0.1:%d/ws_recv_max");
                      nVar1 = nng_dial(local_30,msg + 0xf8,(nng_dialer *)(url + 0xfc),0);
                      pcVar3 = nng_strerror(nVar1);
                      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                             ,0xad,"%s: expected success, got %s (%d)",
                                             "nng_dial(s1, url, &d, 0)",pcVar3,nVar1);
                      if (iVar2 != 0) {
                        nVar1 = nng_dialer_set_size((nng_dialer)url._252_4_,"recv-size-max",0x100);
                        pcVar3 = nng_strerror(nVar1);
                        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                               ,0xae,"%s: expected success, got %s (%d)",
                                               "nng_dialer_set_size(d, NNG_OPT_RECVMAXSZ, 256)",
                                               pcVar3,nVar1);
                        if (iVar2 != 0) {
                          nVar1 = nng_dialer_get_size((nng_dialer)url._252_4_,"recv-size-max",
                                                      (size_t *)&port);
                          pcVar3 = nng_strerror(nVar1);
                          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                                 ,0xaf,"%s: expected success, got %s (%d)",
                                                 "nng_dialer_get_size(d, NNG_OPT_RECVMAXSZ, &sz)",
                                                 pcVar3,nVar1);
                          if (iVar2 != 0) {
                            nVar1 = nng_send(local_30,buf + 0xf8,0x5f,0);
                            pcVar3 = nng_strerror(nVar1);
                            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                                  ,0xb0,"%s: expected success, got %s (%d)",
                                                  "nng_send(s1, msg, 95, 0)",pcVar3,nVar1);
                            if (iVar2 != 0) {
                              nVar1 = nng_socket_set_ms(local_30,"send-timeout",100);
                              pcVar3 = nng_strerror(nVar1);
                              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                                  ,0xb1,"%s: expected success, got %s (%d)",
                                                  "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100)",
                                                  pcVar3,nVar1);
                              if (iVar2 != 0) {
                                nVar1 = nng_recv((nng_socket)l.id,local_348,(size_t *)&port,0);
                                pcVar3 = nng_strerror(nVar1);
                                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                                  ,0xb2,"%s: expected success, got %s (%d)",
                                                  "nng_recv(s0, buf, &sz, 0)",pcVar3,nVar1);
                                if (iVar2 != 0) {
                                  acutest_check_((uint)(_port == 0x5f),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                                 ,0xb3,"%s","sz == 95");
                                  nVar1 = nng_send(local_30,buf + 0xf8,0x96,0);
                                  pcVar3 = nng_strerror(nVar1);
                                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                                  ,0xb4,"%s: expected success, got %s (%d)",
                                                  "nng_send(s1, msg, 150, 0)",pcVar3,nVar1);
                                  if (iVar2 != 0) {
                                    num = nng_recv((nng_socket)l.id,local_348,(size_t *)&port,0);
                                    pcVar3 = nng_strerror(NNG_ETIMEDOUT);
                                    acutest_check_((uint)(num == NNG_ETIMEDOUT),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                                  ,0xb5,"%s fails with %s",
                                                  "nng_recv(s0, buf, &sz, 0)",pcVar3,nVar1);
                                    pcVar3 = nng_strerror(NNG_ETIMEDOUT);
                                    pcVar4 = nng_strerror(num);
                                    acutest_message_("%s: expected %s (%d), got %s (%d)",
                                                     "nng_recv(s0, buf, &sz, 0)",pcVar3,5,pcVar4,
                                                     (ulong)num);
                                    nVar1 = nng_socket_close((nng_socket)l.id);
                                    pcVar3 = nng_strerror(nVar1);
                                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                                  ,0xb6,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(s0)",pcVar3,nVar1);
                                    if (iVar2 != 0) {
                                      nVar1 = nng_socket_close(local_30);
                                      pcVar3 = nng_strerror(nVar1);
                                      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ws/ws_test.c"
                                                  ,0xb7,"%s: expected success, got %s (%d)",
                                                  "nng_socket_close(s1)",pcVar3,nVar1);
                                      if (iVar2 != 0) {
                                        return;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_ws_recv_max(void)
{
	char         msg[256];
	char         buf[256];
	nng_socket   s0;
	nng_socket   s1;
	nng_listener l;
	nng_dialer   d;
	size_t       sz;
	char        *addr;
	char         url[256];
	int          port;

	memset(msg, 0, sizeof(msg)); // required to silence valgrind

	addr = "ws://127.0.0.1:%d/ws_recv_max";
	snprintf(url, sizeof(url), addr, 0);
	NUTS_OPEN(s0);
	NUTS_PASS(nng_socket_set_ms(s0, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_size(s0, NNG_OPT_RECVMAXSZ, 200));
	NUTS_PASS(nng_listener_create(&l, s0, url));
	NUTS_PASS(nng_socket_get_size(s0, NNG_OPT_RECVMAXSZ, &sz));
	NUTS_TRUE(sz == 200);
	NUTS_PASS(nng_listener_set_size(l, NNG_OPT_RECVMAXSZ, 100));
	NUTS_PASS(nng_listener_get_size(l, NNG_OPT_RECVMAXSZ, &sz));
	NUTS_TRUE(sz == 100);
	NUTS_PASS(nng_listener_start(l, 0));
	NUTS_PASS(nng_listener_get_int(l, NNG_OPT_TCP_BOUND_PORT, &port));

	NUTS_OPEN(s1);
	snprintf(url, sizeof(url), addr, port);
	NUTS_PASS(nng_dial(s1, url, &d, 0));
	NUTS_PASS(nng_dialer_set_size(d, NNG_OPT_RECVMAXSZ, 256));
	NUTS_PASS(nng_dialer_get_size(d, NNG_OPT_RECVMAXSZ, &sz));
	NUTS_PASS(nng_send(s1, msg, 95, 0));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_recv(s0, buf, &sz, 0));
	NUTS_TRUE(sz == 95);
	NUTS_PASS(nng_send(s1, msg, 150, 0));
	NUTS_FAIL(nng_recv(s0, buf, &sz, 0), NNG_ETIMEDOUT);
	NUTS_CLOSE(s0);
	NUTS_CLOSE(s1);
}